

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

JSON_Status json_array_replace_number(JSON_Array *array,size_t i,double number)

{
  JSON_Status JVar1;
  JSON_Value *value;
  JSON_Status JVar2;
  
  JVar2 = -1;
  if ((ulong)ABS(number) < 0x7ff0000000000000) {
    value = (JSON_Value *)(*parson_malloc)(0x20);
    if (value != (JSON_Value *)0x0) {
      value->parent = (JSON_Value *)0x0;
      value->type = 3;
      (value->value).number = number;
      JVar1 = json_array_replace_value(array,i,value);
      if (JVar1 == 0) {
        JVar2 = 0;
      }
      else {
        json_value_free(value);
      }
    }
  }
  return JVar2;
}

Assistant:

JSON_Status json_array_replace_number(JSON_Array *array, size_t i, double number) {
    JSON_Value *value = json_value_init_number(number);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_array_replace_value(array, i, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}